

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fst.h
# Opt level: O0

void __thiscall
PDA::Transducer::BasicFst<wchar_t>::Vertex::
Vertex<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
          (Vertex *this,pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *first,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_1,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_2,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_3,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_4,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_5,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_6,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_7,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_8,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_9,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_10,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_11,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_12,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_13,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_14,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_15,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_16,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_17,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_18,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_19,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_20,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_21,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_22,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_23,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_24,
          pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_25)

{
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_local_3;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_local_2;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_local_1;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *rest_local;
  pair<int,_PDA::Transducer::BasicEdge<wchar_t>_> *first_local;
  Vertex *this_local;
  
  std::__cxx11::
  list<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>,_std::allocator<std::pair<int,_PDA::Transducer::BasicEdge<wchar_t>_>_>_>
  ::list(&this->m_transitions);
  std::function<void_()>::function(&this->m_action);
  addTransition<std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>,std::pair<int,PDA::Transducer::BasicEdge<wchar_t>>>
            (this,first,rest,rest_1,rest_2,rest_3,rest_4,rest_5,rest_6,rest_7,rest_8,rest_9,rest_10,
             rest_11,rest_12,rest_13,rest_14,rest_15,rest_16,rest_17,rest_18,rest_19,rest_20,rest_21
             ,rest_22,rest_23,rest_24,rest_25);
  return;
}

Assistant:

Vertex (const First &first, const Rest&... rest)
        {
            addTransition(first, rest...);
        }